

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O0

MPP_RET av1d_parser_init(Av1CodecContext *ctx,ParserCfg *init)

{
  void *pvVar1;
  void *pvVar2;
  AV1Context *s;
  RK_S32 i;
  MPP_RET ret;
  ParserCfg *init_local;
  Av1CodecContext *ctx_local;
  
  if ((av1d_debug & 1) != 0) {
    _mpp_log_l(4,"av1d_parser","enter ctx %p\n","av1d_parser_init",ctx);
  }
  pvVar1 = mpp_osal_calloc("av1d_parser_init",0x1dbe8);
  ctx->priv_data = pvVar1;
  if (ctx->priv_data == (void *)0x0) {
    _mpp_log_l(2,"av1d_parser","av1d codec context malloc fail",(char *)0x0);
    ctx_local._4_4_ = MPP_ERR_NOMEM;
  }
  else {
    pvVar2 = mpp_osal_calloc("av1d_parser_init",0x24c);
    *(void **)((long)pvVar1 + 0x60) = pvVar2;
    *(Av1UnitType **)((long)pvVar1 + 0x1cfb8) = unit_types;
    *(undefined4 *)((long)pvVar1 + 0x1cfc0) = 6;
    *(MppBufSlots *)((long)pvVar1 + 0x1dbb0) = init->packet_slots;
    *(MppBufSlots *)((long)pvVar1 + 0x1dba8) = init->frame_slots;
    *(MppDecCfgSet **)((long)pvVar1 + 0x1dbc0) = init->cfg;
    *(MppDecHwCap **)((long)pvVar1 + 0x1dbe0) = init->hw_info;
    mpp_buf_slot_setup(*(MppBufSlots *)((long)pvVar1 + 0x1dba8),0x19);
    mpp_env_get_u32("av1d_debug",&av1d_debug,0);
    for (s._0_4_ = 0; (int)(uint)s < 8; s._0_4_ = (uint)s + 1) {
      mpp_frame_init((MppFrame *)((long)pvVar1 + (long)(int)(uint)s * 0x2f8 + 0xa8));
      if (*(long *)((long)pvVar1 + (long)(int)(uint)s * 0x2f8 + 0xa8) == 0) {
        _mpp_log_l(2,"av1d_parser","Failed to allocate frame buffer %d\n",(char *)0x0,(ulong)(uint)s
                  );
        return MPP_ERR_NOMEM;
      }
      *(undefined4 *)((long)pvVar1 + (long)(int)(uint)s * 0x2f8 + 0xb0) = 0x7f;
      *(undefined8 *)((long)pvVar1 + (long)(int)(uint)s * 0x2f8 + 0x398) = 0;
    }
    mpp_frame_init((MppFrame *)((long)pvVar1 + 0x1868));
    *(undefined8 *)((long)pvVar1 + 7000) = 0;
    *(undefined4 *)((long)pvVar1 + 0x1870) = 0xff;
    if (*(long *)((long)pvVar1 + 0x1868) == 0) {
      _mpp_log_l(2,"av1d_parser","Failed to allocate frame buffer %d\n",(char *)0x0,(ulong)(uint)s);
      ctx_local._4_4_ = MPP_ERR_NOMEM;
    }
    else {
      *(long *)((long)pvVar1 + 0x1be8) = (long)pvVar1 + 0x1bf8;
      *(long *)((long)pvVar1 + 0x1bf0) = (long)pvVar1 + 0x4bd8;
      AV1SetDefaultCDFs(*(AV1CDFs **)((long)pvVar1 + 0x1be8),*(MvCDFs **)((long)pvVar1 + 0x1bf0));
      ctx_local._4_4_ = MPP_OK;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET av1d_parser_init(Av1CodecContext *ctx, ParserCfg *init)
{
    MPP_RET ret = MPP_OK;
    RK_S32 i = 0;
    av1d_dbg_func("enter ctx %p\n", ctx);
    AV1Context *s = mpp_calloc(AV1Context, 1);
    ctx->priv_data = (void*)s;
    if (!ctx->priv_data) {
        mpp_err("av1d codec context malloc fail");
        return MPP_ERR_NOMEM;
    }

    s->seq_ref = mpp_calloc(AV1RawSequenceHeader, 1);

    s->unit_types = unit_types;
    s->nb_unit_types = MPP_ARRAY_ELEMS(unit_types);
    s->packet_slots = init->packet_slots;
    s->slots = init->frame_slots;
    s->cfg = init->cfg;
    s->hw_info = init->hw_info;
    mpp_buf_slot_setup(s->slots, 25);

    mpp_env_get_u32("av1d_debug", &av1d_debug, 0);
    for (i = 0; i < AV1_NUM_REF_FRAMES; i++) {
        mpp_frame_init(&s->ref[i].f);
        if (!s->ref[i].f) {
            mpp_err("Failed to allocate frame buffer %d\n", i);
            return MPP_ERR_NOMEM;
        }
        s->ref[i].slot_index = 0x7f;
        s->ref[i].ref = NULL;
    }

    mpp_frame_init(&s->cur_frame.f);
    s->cur_frame.ref = NULL;
    s->cur_frame.slot_index = 0xff;
    if (!s->cur_frame.f) {
        mpp_err("Failed to allocate frame buffer %d\n", i);
        return MPP_ERR_NOMEM;
    }
    s->cdfs = &s->default_cdfs;
    s->cdfs_ndvc = &s->default_cdfs_ndvc;
    AV1SetDefaultCDFs(s->cdfs, s->cdfs_ndvc);

    return MPP_OK;

    av1d_dbg_func("leave ctx %p\n", ctx);

    return ret;
}